

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitYieldAndResume(RegSlot resumeValueReg,RegSlot inputReg,ByteCodeLabel resumeNormalLabel,
                       ByteCodeLabel resumeThrowLabel,ByteCodeGenerator *byteCodeGenerator,
                       FuncInfo *funcInfo)

{
  code *pcVar1;
  bool bVar2;
  uint *puVar3;
  undefined4 *puVar4;
  uint local_44;
  uint local_40;
  uint local_3c;
  RegSlot throwConst;
  RegSlot local_34;
  RegSlot normalConst;
  RegSlot resumeKindReg;
  ByteCodeWriter *writer;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ByteCodeLabel resumeThrowLabel_local;
  ByteCodeLabel resumeNormalLabel_local;
  RegSlot inputReg_local;
  RegSlot resumeValueReg_local;
  
  writer = (ByteCodeWriter *)funcInfo;
  funcInfo_local = (FuncInfo *)byteCodeGenerator;
  byteCodeGenerator_local._0_4_ = resumeThrowLabel;
  byteCodeGenerator_local._4_4_ = resumeNormalLabel;
  resumeThrowLabel_local = inputReg;
  resumeNormalLabel_local = resumeValueReg;
  _normalConst = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::SetCurrentLoopHasYield(_normalConst);
  if (resumeThrowLabel_local != *(int *)((long)&(writer->m_auxiliaryData).current + 4)) {
    Js::ByteCodeWriter::Reg2
              (_normalConst,Ld_A,*(RegSlot *)((long)&(writer->m_auxiliaryData).current + 4),
               resumeThrowLabel_local);
  }
  ByteCodeGenerator::EmitLeaveOpCodesBeforeYield((ByteCodeGenerator *)funcInfo_local);
  Js::ByteCodeWriter::Reg2
            (_normalConst,Yield,*(RegSlot *)((long)&(writer->m_auxiliaryData).current + 4),
             *(RegSlot *)((long)&(writer->m_auxiliaryData).current + 4));
  ByteCodeGenerator::EmitTryBlockHeadersAfterYield((ByteCodeGenerator *)funcInfo_local);
  local_34 = FuncInfo::AcquireTmpRegister((FuncInfo *)writer);
  EmitGetObjectProperty
            (local_34,*(RegSlot *)((long)&(writer->m_auxiliaryData).current + 4),0xe7,
             (ByteCodeGenerator *)funcInfo_local,(FuncInfo *)writer);
  EmitGetObjectProperty
            (resumeNormalLabel_local,*(RegSlot *)((long)&(writer->m_auxiliaryData).current + 4),
             0x197,(ByteCodeGenerator *)funcInfo_local,(FuncInfo *)writer);
  local_3c = 0;
  puVar3 = JsUtil::
           BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ::Lookup((BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&(writer->m_auxContextData).head,&local_3c,&Js::Constants::NoRegister);
  throwConst = *puVar3;
  if (throwConst == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x2911,"(normalConst != Js::Constants::NoRegister)",
                       "normalConst != Js::Constants::NoRegister");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  Js::ByteCodeWriter::BrReg2
            (_normalConst,BrSrEq_A,byteCodeGenerator_local._4_4_,local_34,throwConst);
  if ((ByteCodeLabel)byteCodeGenerator_local != -1) {
    local_44 = 1;
    puVar3 = JsUtil::
             BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::Lookup((BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       *)&(writer->m_auxContextData).head,&local_44,&Js::Constants::NoRegister);
    local_40 = *puVar3;
    if (local_40 == 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x291c,"(throwConst != Js::Constants::NoRegister)",
                         "throwConst != Js::Constants::NoRegister");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    Js::ByteCodeWriter::BrReg2
              (_normalConst,BrSrEq_A,(ByteCodeLabel)byteCodeGenerator_local,local_34,local_40);
  }
  FuncInfo::ReleaseTmpRegister((FuncInfo *)writer,local_34);
  return;
}

Assistant:

void EmitYieldAndResume(
    Js::RegSlot resumeValueReg,
    Js::RegSlot inputReg,
    Js::ByteCodeLabel resumeNormalLabel,
    Js::ByteCodeLabel resumeThrowLabel,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    // If `resultThrowLabel` is a valid label, then the instruction
    // sequence following this call must handle the return yield resume
    // case. Otherwise, the instruction sequence following this call
    // must handle both the throw and return cases.

    auto* writer = byteCodeGenerator->Writer();

    // If in a loop mark it as containing Yield and hence not eligible for Jit loop body
    writer->SetCurrentLoopHasYield();

    if (inputReg != funcInfo->yieldRegister)
        writer->Reg2(Js::OpCode::Ld_A, funcInfo->yieldRegister, inputReg);

    // Yield the result. On resume, the resume yield object will be in yieldRegister
    byteCodeGenerator->EmitLeaveOpCodesBeforeYield();
    writer->Reg2(Js::OpCode::Yield, funcInfo->yieldRegister, funcInfo->yieldRegister);
    byteCodeGenerator->EmitTryBlockHeadersAfterYield();

    Js::RegSlot resumeKindReg = funcInfo->AcquireTmpRegister();

    // Get the "kind" property of the resume object
    EmitGetObjectProperty(
        resumeKindReg,
        funcInfo->yieldRegister,
        Js::PropertyIds::kind,
        byteCodeGenerator,
        funcInfo);

    // Get the "value" property of the resume object
    EmitGetObjectProperty(
        resumeValueReg,
        funcInfo->yieldRegister,
        Js::PropertyIds::value,
        byteCodeGenerator,
        funcInfo);

    Js::RegSlot normalConst = funcInfo->constantToRegister.Lookup(
        (uint)Js::ResumeYieldKind::Normal,
        Js::Constants::NoRegister);

    Assert(normalConst != Js::Constants::NoRegister);

    // Branch to normal resume if kind is Normal
    writer->BrReg2(Js::OpCode::BrSrEq_A, resumeNormalLabel, resumeKindReg, normalConst);

    if (resumeThrowLabel != Js::Constants::NoByteCodeLabel)
    {
        Js::RegSlot throwConst = funcInfo->constantToRegister.Lookup(
            (uint)Js::ResumeYieldKind::Throw,
            Js::Constants::NoRegister);

        Assert(throwConst != Js::Constants::NoRegister);

        // Branch to throw if kind is Throw
        writer->BrReg2(Js::OpCode::BrSrEq_A, resumeThrowLabel, resumeKindReg, throwConst);
    }

    funcInfo->ReleaseTmpRegister(resumeKindReg);
}